

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

int cram_huffman_decode_int0(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  int iVar1;
  cram_huffman_code *pcVar2;
  cram_huffman_code *codes;
  int n;
  int i;
  int32_t *out_i;
  int *out_size_local;
  char *out_local;
  cram_block *in_local;
  cram_codec *c_local;
  cram_slice *slice_local;
  
  pcVar2 = (c->field_6).huffman.codes;
  codes._4_4_ = 0;
  iVar1 = *out_size;
  for (; codes._4_4_ < iVar1; codes._4_4_ = codes._4_4_ + 1) {
    *(int32_t *)(out + (long)codes._4_4_ * 4) = pcVar2->symbol;
  }
  return 0;
}

Assistant:

int cram_huffman_decode_int0(cram_slice *slice, cram_codec *c,
			     cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int i, n;
    const cram_huffman_code * const codes = c->huffman.codes;

    /* Special case of 0 length codes */
    for (i = 0, n = *out_size; i < n; i++) {
	out_i[i] = codes[0].symbol;
    }
    return 0;
}